

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

void __thiscall
QTextStreamPrivate::putString(QTextStreamPrivate *this,QUtf8StringView data,bool number)

{
  long lVar1;
  byte number_00;
  byte in_CL;
  QTextStreamPrivate *in_RDI;
  long in_FS_OFFSET;
  QString *str;
  undefined7 in_stack_ffffffffffffffb0;
  QStringView in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  number_00 = in_CL & 1;
  str = (QString *)&stack0xffffffffffffffc0;
  QBasicUtf8StringView<false>::toString((QBasicUtf8StringView<false> *)in_RDI);
  QStringView::QStringView<QString,_true>
            ((QStringView *)CONCAT17(number_00,in_stack_ffffffffffffffb0),str);
  putString(in_RDI,in_stack_ffffffffffffffc0,(bool)number_00);
  QString::~QString((QString *)0x1353c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextStreamPrivate::putString(QUtf8StringView data, bool number)
{
    putString(data.toString(), number);
}